

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileProfilingData.cxx
# Opt level: O1

void __thiscall
cmMakefileProfilingData::cmMakefileProfilingData
          (cmMakefileProfilingData *this,string *profileStream)

{
  StreamWriter *pSVar1;
  StreamWriter *pSVar2;
  runtime_error *this_00;
  StreamWriterBuilder wbuilder;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  StreamWriterBuilder local_58;
  
  std::ofstream::ofstream(this);
  (this->JsonWriter)._M_t.
  super___uniq_ptr_impl<Json::StreamWriter,_std::default_delete<Json::StreamWriter>_>._M_t.
  super__Tuple_impl<0UL,_Json::StreamWriter_*,_std::default_delete<Json::StreamWriter>_>.
  super__Head_base<0UL,_Json::StreamWriter_*,_false>._M_head_impl = (StreamWriter *)0x0;
  std::ofstream::open((char *)this,(_Ios_Openmode)(profileStream->_M_dataplus)._M_p);
  Json::StreamWriterBuilder::StreamWriterBuilder(&local_58);
  pSVar2 = Json::StreamWriterBuilder::newStreamWriter(&local_58);
  pSVar1 = (this->JsonWriter)._M_t.
           super___uniq_ptr_impl<Json::StreamWriter,_std::default_delete<Json::StreamWriter>_>._M_t.
           super__Tuple_impl<0UL,_Json::StreamWriter_*,_std::default_delete<Json::StreamWriter>_>.
           super__Head_base<0UL,_Json::StreamWriter_*,_false>._M_head_impl;
  (this->JsonWriter)._M_t.
  super___uniq_ptr_impl<Json::StreamWriter,_std::default_delete<Json::StreamWriter>_>._M_t.
  super__Tuple_impl<0UL,_Json::StreamWriter_*,_std::default_delete<Json::StreamWriter>_>.
  super__Head_base<0UL,_Json::StreamWriter_*,_false>._M_head_impl = pSVar2;
  if (pSVar1 != (StreamWriter *)0x0) {
    (*pSVar1->_vptr_StreamWriter[1])();
  }
  if (*(int *)(&(this->ProfileStream).super_basic_ostream<char,_std::char_traits<char>_>.field_0x20
              + (long)(this->ProfileStream).super_basic_ostream<char,_std::char_traits<char>_>.
                      _vptr_basic_ostream[-3]) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"[",1);
    Json::StreamWriterBuilder::~StreamWriterBuilder(&local_58);
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"Unable to open: ","");
  std::operator+(&local_78,&local_98,profileStream);
  std::runtime_error::runtime_error(this_00,(string *)&local_78);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

cmMakefileProfilingData::cmMakefileProfilingData(
  const std::string& profileStream)
{
  std::ios::openmode omode = std::ios::out | std::ios::trunc;
  this->ProfileStream.open(profileStream.c_str(), omode);
  Json::StreamWriterBuilder wbuilder;
  this->JsonWriter =
    std::unique_ptr<Json::StreamWriter>(wbuilder.newStreamWriter());
  if (!this->ProfileStream.good()) {
    throw std::runtime_error(std::string("Unable to open: ") + profileStream);
  }

  this->ProfileStream << "[";
}